

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O0

ostream * soplex::operator<<(ostream *os,SVectorBase<double> *v)

{
  bool bVar1;
  int iVar2;
  double *pdVar3;
  ostream *poVar4;
  char *pcVar5;
  int __c;
  SVectorBase<double> *in_RSI;
  ostream *in_RDI;
  int j;
  int i;
  uint local_14;
  
  bVar1 = false;
  for (local_14 = 0; iVar2 = SVectorBase<double>::size(in_RSI), (int)local_14 < iVar2;
      local_14 = local_14 + 1) {
    if (bVar1) {
      pdVar3 = SVectorBase<double>::value(in_RSI,local_14);
      if (0.0 < *pdVar3 || *pdVar3 == 0.0) {
        poVar4 = std::operator<<(in_RDI," + ");
        pdVar3 = SVectorBase<double>::value(in_RSI,local_14);
        std::ostream::operator<<(poVar4,*pdVar3);
      }
      else {
        poVar4 = std::operator<<(in_RDI," - ");
        pdVar3 = SVectorBase<double>::value(in_RSI,local_14);
        std::ostream::operator<<(poVar4,-*pdVar3);
      }
    }
    else {
      pdVar3 = SVectorBase<double>::value(in_RSI,local_14);
      std::ostream::operator<<(in_RDI,*pdVar3);
    }
    poVar4 = std::operator<<(in_RDI," x");
    pcVar5 = SVectorBase<double>::index(in_RSI,(char *)(ulong)local_14,__c);
    std::ostream::operator<<(poVar4,(int)pcVar5);
    bVar1 = true;
    if ((int)(local_14 + 1) % 4 == 0) {
      std::operator<<(in_RDI,"\n\t");
    }
  }
  return in_RDI;
}

Assistant:

inline
std::ostream& operator<<(std::ostream& os, const SVectorBase<R>& v)
{
   for(int i = 0, j = 0; i < v.size(); ++i)
   {
      if(j)
      {
         if(v.value(i) < 0)
            os << " - " << -v.value(i);
         else
            os << " + " << v.value(i);
      }
      else
         os << v.value(i);

      os << " x" << v.index(i);
      j = 1;

      if((i + 1) % 4 == 0)
         os << "\n\t";
   }

   return os;
}